

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

Vec_Int_t *
Acb_NtkCollectWindow(Acb_Ntk_t *p,int Pivot,Vec_Int_t *vTfi,Vec_Int_t *vTfo,Vec_Int_t *vRoots)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  bool local_66;
  int fIsTfiInput;
  int *pFanins;
  int iFanin;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vWin;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vTfo_local;
  Vec_Int_t *vTfi_local;
  int Pivot_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_IntEntryLast(vTfi);
  if (iVar1 != Pivot) {
    __assert_fail("Vec_IntEntryLast(vTfi) == Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x2ef,
                  "Vec_Int_t *Acb_NtkCollectWindow(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Acb_NtkIncTravId(p);
  for (iObj = 0; iVar1 = Vec_IntSize(vTfi), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vTfi,iObj);
    Acb_ObjSetTravIdCur(p,iVar1);
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vTfi), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vTfi,iObj);
    local_66 = false;
    iFanin = 0;
    piVar3 = Acb_ObjFanins(p,iVar1);
    for (; iFanin < *piVar3; iFanin = iFanin + 1) {
      iVar2 = Acb_ObjIsTravIdCur(p,piVar3[iFanin + 1]);
      if (iVar2 == 0) {
        local_66 = true;
      }
    }
    iVar2 = Acb_ObjIsCi(p,iVar1);
    local_66 = iVar2 != 0 || local_66;
    iVar1 = Abc_Var2Lit(iVar1,(uint)local_66);
    Vec_IntPush(p_00,iVar1);
  }
  Acb_NtkIncTravId(p);
  for (iObj = 0; iVar1 = Vec_IntSize(vRoots), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vRoots,iObj);
    Acb_ObjSetTravIdCur(p,iVar1);
  }
  iObj = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vTfo);
    if (iVar1 <= iObj) {
      return p_00;
    }
    iVar1 = Vec_IntEntry(vTfo,iObj);
    iVar2 = Acb_ObjIsCo(p,iVar1);
    if (iVar2 != 0) break;
    iVar2 = Acb_ObjIsTravIdCur(p,iVar1);
    iVar1 = Abc_Var2Lit(iVar1,iVar2);
    Vec_IntPush(p_00,iVar1);
    iObj = iObj + 1;
  }
  __assert_fail("!Acb_ObjIsCo(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                ,0x304,
                "Vec_Int_t *Acb_NtkCollectWindow(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Int_t * Acb_NtkCollectWindow( Acb_Ntk_t * p, int Pivot, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vRoots )
{
    Vec_Int_t * vWin = Vec_IntAlloc( 100 );
    int i, k, iObj, iFanin, * pFanins;
    assert( Vec_IntEntryLast(vTfi) == Pivot );
    // mark nodes
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vTfi, iObj, i )
        Acb_ObjSetTravIdCur(p, iObj);
    // add TFI
    Vec_IntForEachEntry( vTfi, iObj, i )
    {
        int fIsTfiInput = 0;
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            if ( !Acb_ObjIsTravIdCur(p, iFanin) ) // fanin is not in TFI
                fIsTfiInput = 1; // mark as leaf
        Vec_IntPush( vWin, Abc_Var2Lit(iObj, Acb_ObjIsCi(p, iObj) || fIsTfiInput) );
    }
    // mark roots
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vRoots, iObj, i )
        Acb_ObjSetTravIdCur(p, iObj);
    // add TFO
    Vec_IntForEachEntry( vTfo, iObj, i )
    {
        assert( !Acb_ObjIsCo(p, iObj) );
        Vec_IntPush( vWin, Abc_Var2Lit(iObj, Acb_ObjIsTravIdCur(p, iObj)) );
    }
    return vWin;
}